

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O3

void __thiscall leveldb::Block::Iter::Prev(Iter *this)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = this->restarts_;
  uVar2 = this->current_;
  uVar4 = this->restart_index_;
  uVar5 = (ulong)uVar4;
  if (*(uint *)(this->data_ + uVar5 * 4 + (ulong)uVar1) < uVar2) {
    uVar6 = uVar5 * 4;
  }
  else {
    uVar7 = uVar5 * 4;
    do {
      uVar7 = uVar7 - 4;
      if (uVar7 == 0xfffffffffffffffc) {
        this->current_ = uVar1;
        this->restart_index_ = this->num_restarts_;
        return;
      }
      uVar4 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar4;
      this->restart_index_ = uVar4;
      uVar6 = uVar7 & 0x3fffffffc;
    } while (uVar2 <= *(uint *)(this->data_ + uVar6 + uVar1));
  }
  (this->key_)._M_string_length = 0;
  *(this->key_)._M_dataplus._M_p = '\0';
  this->restart_index_ = uVar4;
  (this->value_).data_ = this->data_ + *(uint *)(this->data_ + uVar6 + this->restarts_);
  (this->value_).size_ = 0;
  do {
    bVar3 = ParseNextKey(this);
    if (!bVar3) {
      return;
    }
  } while ((this->value_).data_ + ((this->value_).size_ - (long)this->data_) < (char *)(ulong)uVar2)
  ;
  return;
}

Assistant:

void Prev() override {
    assert(Valid());

    // Scan backwards to a restart point before current_
    const uint32_t original = current_;
    while (GetRestartPoint(restart_index_) >= original) {
      if (restart_index_ == 0) {
        // No more entries
        current_ = restarts_;
        restart_index_ = num_restarts_;
        return;
      }
      restart_index_--;
    }

    SeekToRestartPoint(restart_index_);
    do {
      // Loop until end of current entry hits the start of original entry
    } while (ParseNextKey() && NextEntryOffset() < original);
  }